

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O2

void Imf_3_4::anon_unknown_0::interleave_sse2(char *source,size_t outSize,char *out)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  ulong uVar32;
  char *pcVar33;
  char *pcVar34;
  __m128i *v1;
  char *pcVar35;
  long lVar36;
  long lVar37;
  
  uVar32 = outSize + 1 >> 1;
  lVar37 = 0;
  for (lVar36 = 0; (outSize >> 1 & 0xfffffffffffffff0) + lVar36 != 0; lVar36 = lVar36 + -0x10) {
    pcVar33 = source + lVar37 * 2;
    cVar1 = pcVar33[1];
    cVar2 = pcVar33[2];
    cVar3 = pcVar33[3];
    cVar4 = pcVar33[4];
    cVar5 = pcVar33[5];
    cVar6 = pcVar33[6];
    cVar7 = pcVar33[7];
    cVar8 = pcVar33[8];
    cVar9 = pcVar33[9];
    cVar10 = pcVar33[10];
    cVar11 = pcVar33[0xb];
    cVar12 = pcVar33[0xc];
    cVar13 = pcVar33[0xd];
    cVar14 = pcVar33[0xe];
    cVar15 = pcVar33[0xf];
    pcVar35 = source + lVar37 * 2 + uVar32;
    cVar16 = *pcVar35;
    cVar17 = pcVar35[1];
    cVar18 = pcVar35[2];
    cVar19 = pcVar35[3];
    cVar20 = pcVar35[4];
    cVar21 = pcVar35[5];
    cVar22 = pcVar35[6];
    cVar23 = pcVar35[7];
    cVar24 = pcVar35[8];
    cVar25 = pcVar35[9];
    cVar26 = pcVar35[10];
    cVar27 = pcVar35[0xb];
    cVar28 = pcVar35[0xc];
    cVar29 = pcVar35[0xd];
    cVar30 = pcVar35[0xe];
    cVar31 = pcVar35[0xf];
    *out = *pcVar33;
    out[1] = cVar16;
    out[2] = cVar1;
    out[3] = cVar17;
    out[4] = cVar2;
    out[5] = cVar18;
    out[6] = cVar3;
    out[7] = cVar19;
    out[8] = cVar4;
    out[9] = cVar20;
    out[10] = cVar5;
    out[0xb] = cVar21;
    out[0xc] = cVar6;
    out[0xd] = cVar22;
    out[0xe] = cVar7;
    out[0xf] = cVar23;
    out[0x10] = cVar8;
    out[0x11] = cVar24;
    out[0x12] = cVar9;
    out[0x13] = cVar25;
    out[0x14] = cVar10;
    out[0x15] = cVar26;
    out[0x16] = cVar11;
    out[0x17] = cVar27;
    out[0x18] = cVar12;
    out[0x19] = cVar28;
    out[0x1a] = cVar13;
    out[0x1b] = cVar29;
    out[0x1c] = cVar14;
    out[0x1d] = cVar30;
    out[0x1e] = cVar15;
    out[0x1f] = cVar31;
    out = out + 0x20;
    lVar37 = lVar37 + 8;
  }
  pcVar33 = source + (uVar32 - lVar36);
  pcVar35 = source + -lVar36;
  for (lVar37 = 0; uVar32 = (outSize & 0xffffffffffffffe0) + lVar37, uVar32 < outSize;
      lVar37 = lVar37 + 1) {
    uVar32 = (ulong)((uint)uVar32 & 1);
    pcVar34 = pcVar33;
    if (uVar32 == 0) {
      pcVar34 = pcVar35;
    }
    out[lVar37] = *pcVar34;
    pcVar33 = pcVar33 + uVar32;
    pcVar35 = pcVar35 + (uVar32 ^ 1);
  }
  return;
}

Assistant:

void
interleave_sse2 (const char* source, size_t outSize, char* out)
{
    static const size_t bytesPerChunk = 2 * sizeof (__m128i);

    const size_t vOutSize = outSize / bytesPerChunk;

    const __m128i* v1 = reinterpret_cast<const __m128i*> (source);
    const __m128i* v2 =
        reinterpret_cast<const __m128i*> (source + (outSize + 1) / 2);
    __m128i* vOut = reinterpret_cast<__m128i*> (out);

    for (size_t i = 0; i < vOutSize; ++i)
    {
        __m128i a = _mm_loadu_si128 (v1++);
        __m128i b = _mm_loadu_si128 (v2++);

        __m128i lo = _mm_unpacklo_epi8 (a, b);
        __m128i hi = _mm_unpackhi_epi8 (a, b);

        _mm_storeu_si128 (vOut++, lo);
        _mm_storeu_si128 (vOut++, hi);
    }

    const char* t1   = reinterpret_cast<const char*> (v1);
    const char* t2   = reinterpret_cast<const char*> (v2);
    char*       sOut = reinterpret_cast<char*> (vOut);

    for (size_t i = vOutSize * bytesPerChunk; i < outSize; ++i)
    {
        *(sOut++) = (i % 2 == 0) ? *(t1++) : *(t2++);
    }
}